

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fusion.c
# Opt level: O0

void aead_do_encrypt(st_ptls_aead_context_t *_ctx,void *output,void *input,size_t inlen,uint64_t seq
                    ,void *aad,size_t aadlen,ptls_aead_supplementary_encryption_t *supp)

{
  ptls_fusion_aesgcm_context_t *ppVar1;
  __m128i ctr;
  aesgcm_context *ctx;
  void *aad_local;
  uint64_t seq_local;
  size_t inlen_local;
  void *input_local;
  void *output_local;
  st_ptls_aead_context_t *_ctx_local;
  
  if (_ctx[1].algo[4].setup_crypto <
      (_func_int_ptls_aead_context_t_ptr_int_void_ptr_void_ptr *)(inlen + aadlen)) {
    ppVar1 = ptls_fusion_aesgcm_set_capacity
                       ((ptls_fusion_aesgcm_context_t *)_ctx[1].algo,inlen + aadlen);
    _ctx[1].algo = (st_ptls_aead_algorithm_t *)ppVar1;
  }
  ppVar1 = (ptls_fusion_aesgcm_context_t *)_ctx[1].algo;
  calc_counter((aesgcm_context *)_ctx,seq);
  ctr[1] = aadlen;
  ctr[0] = (longlong)aad;
  ptls_fusion_aesgcm_encrypt
            (ppVar1,output,input,inlen,ctr,supp,(size_t)ppVar1,
             (ptls_aead_supplementary_encryption_t *)output);
  return;
}

Assistant:

void aead_do_encrypt(struct st_ptls_aead_context_t *_ctx, void *output, const void *input, size_t inlen, uint64_t seq,
                     const void *aad, size_t aadlen, ptls_aead_supplementary_encryption_t *supp)
{
    struct aesgcm_context *ctx = (void *)_ctx;

    if (inlen + aadlen > ctx->aesgcm->capacity)
        ctx->aesgcm = ptls_fusion_aesgcm_set_capacity(ctx->aesgcm, inlen + aadlen);
    ptls_fusion_aesgcm_encrypt(ctx->aesgcm, output, input, inlen, calc_counter(ctx, seq), aad, aadlen, supp);
}